

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

int Dice::roll(void)

{
  pointer *this;
  initializer_list<unsigned_int> __il;
  result_type_conflict rVar1;
  int roll;
  uniform_int_distribution<int> dist;
  mt19937 eng;
  result_type_conflict1 local_13d8;
  result_type_conflict1 local_13d4;
  result_type_conflict1 local_13d0;
  result_type_conflict1 local_13cc;
  result_type_conflict1 local_13c8;
  result_type_conflict1 local_13c4;
  result_type_conflict1 local_13c0;
  result_type_conflict1 local_13bc;
  iterator local_13b8;
  undefined8 local_13b0;
  undefined1 local_13a8 [8];
  seed_seq seed;
  random_device r;
  
  this = &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::random_device::random_device((random_device *)this);
  local_13d8 = std::random_device::operator()((random_device *)this);
  local_13d4 = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13d0 = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13cc = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13c8 = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13c4 = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13c0 = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13bc = std::random_device::operator()
                         ((random_device *)
                          &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_13b8 = &local_13d8;
  local_13b0 = 8;
  __il._M_len = 8;
  __il._M_array = local_13b8;
  std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)local_13a8,__il);
  std::
  mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
  ::mersenne_twister_engine<std::seed_seq,void>
            ((mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
              *)&dist,(seed_seq *)local_13a8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&stack0xffffffffffffd888,1,6);
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&stack0xffffffffffffd888,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&dist);
  std::seed_seq::~seed_seq((seed_seq *)local_13a8);
  std::random_device::~random_device
            ((random_device *)
             &seed._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return rVar1;
}

Assistant:

int Dice::roll() {
    std::random_device r;
    std::seed_seq seed{r(), r(), r(), r(), r(), r(), r(), r()};
    std::mt19937 eng{seed};
    std::uniform_int_distribution<> dist(1, 6);

    int roll = dist(eng);

    return roll;
}